

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::
CppGeneratorTest_InheritedStringTypeCordNotForExtension_Test::TestBody
          (CppGeneratorTest_InheritedStringTypeCordNotForExtension_Test *this)

{
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CppGeneratorTest_InheritedStringTypeCordNotForExtension_Test *local_10;
  CppGeneratorTest_InheritedStringTypeCordNotForExtension_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    edition = \"2024\";\n    import \"google/protobuf/cpp_features.proto\";\n    option features.(pb.cpp).string_type = CORD;\n\n    message Foo {\n      extensions 1 to max;\n    }\n    extend Foo {\n      bytes bar = 1;\n    }\n  "
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,
             "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir --experimental_editions foo.proto"
            );
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,local_40);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, InheritedStringTypeCordNotForExtension) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2024";
    import "google/protobuf/cpp_features.proto";
    option features.(pb.cpp).string_type = CORD;

    message Foo {
      extensions 1 to max;
    }
    extend Foo {
      bytes bar = 1;
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir "
      "--experimental_editions foo.proto");

  ExpectNoErrors();
}